

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O3

ze_result_t zesGetEngineProcAddrTable(ze_api_version_t version,zes_engine_dditable_t *pDdiTable)

{
  undefined8 *puVar1;
  long lVar2;
  zes_pfnEngineGetActivity_t p_Var3;
  bool bVar4;
  int iVar5;
  ze_result_t zVar6;
  code *UNRECOVERED_JUMPTABLE;
  iterator __begin1;
  undefined8 *puVar7;
  
  puVar7 = (undefined8 *)**(long **)(loader::context + 0x1610);
  puVar1 = (undefined8 *)(*(long **)(loader::context + 0x1610))[1];
  if (puVar1 == puVar7) {
LAB_001be7ea:
    zVar6 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else if (pDdiTable == (zes_engine_dditable_t *)0x0) {
    zVar6 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else {
    zVar6 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if ((int)version <= *(int *)(loader::context + 0x15c0)) {
      bVar4 = false;
      do {
        while ((*(int *)(puVar7 + 1) != 0 ||
               (UNRECOVERED_JUMPTABLE = (code *)dlsym(*puVar7,"zesGetEngineProcAddrTable"),
               UNRECOVERED_JUMPTABLE == (code *)0x0))) {
LAB_001be767:
          puVar7 = puVar7 + 0x1b3;
          if (puVar7 == puVar1) {
            if (!bVar4) goto LAB_001be7ea;
            goto LAB_001be793;
          }
        }
        iVar5 = (*UNRECOVERED_JUMPTABLE)(version,puVar7 + 0x16f);
        if (iVar5 != 0) {
          *(int *)(puVar7 + 1) = iVar5;
          goto LAB_001be767;
        }
        puVar7 = puVar7 + 0x1b3;
        bVar4 = true;
      } while (puVar7 != puVar1);
LAB_001be793:
      lVar2 = **(long **)(loader::context + 0x1610);
      if (((ulong)(((*(long **)(loader::context + 0x1610))[1] - lVar2 >> 3) * 0x7aff6957aff6957b) <
           2) && (*(char *)(loader::context + 0x1629) != '\x01')) {
        pDdiTable->pfnGetActivityExt = *(zes_pfnEngineGetActivityExt_t *)(lVar2 + 0xb88);
        p_Var3 = *(zes_pfnEngineGetActivity_t *)(lVar2 + 0xb80);
        pDdiTable->pfnGetProperties = *(zes_pfnEngineGetProperties_t *)(lVar2 + 0xb78);
        pDdiTable->pfnGetActivity = p_Var3;
      }
      else {
        pDdiTable->pfnGetProperties = loader::zesEngineGetProperties;
        pDdiTable->pfnGetActivity = loader::zesEngineGetActivity;
        pDdiTable->pfnGetActivityExt = loader::zesEngineGetActivityExt;
      }
      if (*(long *)(loader::context + 0x1618) == 0) {
        zVar6 = ZE_RESULT_SUCCESS;
      }
      else {
        UNRECOVERED_JUMPTABLE =
             (code *)dlsym(*(long *)(loader::context + 0x1618),"zesGetEngineProcAddrTable");
        zVar6 = ZE_RESULT_ERROR_UNINITIALIZED;
        if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
          zVar6 = (*UNRECOVERED_JUMPTABLE)(version,pDdiTable);
          return zVar6;
        }
      }
    }
  }
  return zVar6;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zesGetEngineProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zes_engine_dditable_t* pDdiTable                ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( loader::context->sysmanInstanceDrivers->size() < 1 ) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( loader::context->version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    bool atLeastOneDriverValid = false;
    // Load the device-driver DDI tables
    for( auto& drv : *loader::context->sysmanInstanceDrivers )
    {
        if(drv.initStatus != ZE_RESULT_SUCCESS)
            continue;
        auto getTable = reinterpret_cast<zes_pfnGetEngineProcAddrTable_t>(
            GET_FUNCTION_PTR( drv.handle, "zesGetEngineProcAddrTable") );
        if(!getTable) 
            continue; 
        auto getTableResult = getTable( version, &drv.dditable.zes.Engine);
        if(getTableResult == ZE_RESULT_SUCCESS) 
            atLeastOneDriverValid = true;
        else
            drv.initStatus = getTableResult;
    }

    if(!atLeastOneDriverValid)
        result = ZE_RESULT_ERROR_UNINITIALIZED;
    else
        result = ZE_RESULT_SUCCESS;

    if( ZE_RESULT_SUCCESS == result )
    {
        if( ( loader::context->sysmanInstanceDrivers->size() > 1 ) || loader::context->forceIntercept )
        {
            // return pointers to loader's DDIs
            pDdiTable->pfnGetProperties                            = loader::zesEngineGetProperties;
            pDdiTable->pfnGetActivity                              = loader::zesEngineGetActivity;
            pDdiTable->pfnGetActivityExt                           = loader::zesEngineGetActivityExt;
        }
        else
        {
            // return pointers directly to driver's DDIs
            *pDdiTable = loader::context->sysmanInstanceDrivers->front().dditable.zes.Engine;
        }
    }

    // If the validation layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->validationLayer ))
    {
        auto getTable = reinterpret_cast<zes_pfnGetEngineProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->validationLayer, "zesGetEngineProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        result = getTable( version, pDdiTable );
    }

    return result;
}